

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O1

bool beast::isNumeric(string *s)

{
  pointer pcVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint __len;
  int n;
  uint local_74;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_70._M_current = (char *)local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + s->_M_string_length)
  ;
  bVar3 = detail::parseSigned<int,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((int *)&local_74,local_70,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_70._M_current + local_68));
  if ((long *)local_70._M_current != local_60) {
    operator_delete(local_70._M_current,local_60[0] + 1);
  }
  if (bVar3) {
    __val = -local_74;
    if (0 < (int)local_74) {
      __val = local_74;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar5 = (uint)uVar6;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_001c01bc;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_001c01bc;
        }
        if (uVar5 < 10000) goto LAB_001c01bc;
        uVar6 = uVar6 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_001c01bc:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)local_74 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_50 + (ulong)(local_74 >> 0x1f)),__len,__val);
    if (local_48 == s->_M_string_length) {
      if (local_48 == 0) {
        bVar3 = true;
      }
      else {
        iVar4 = bcmp(local_50,(s->_M_dataplus)._M_p,local_48);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool isNumeric (std::string const& s)
{
    int n;

    // Must be convertible to an integer
    if (!lexicalCastChecked (n, s))
        return false;

    // Must not have leading zeroes
    return std::to_string (n) == s;
}